

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<mp::NumericConstant>::Matcher
          (Matcher<mp::NumericConstant> *this,NumericConstant value)

{
  MatcherBase<mp::NumericConstant> local_30;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  
  (this->super_MatcherBase<mp::NumericConstant>).impl_.value_ =
       (MatcherInterface<mp::NumericConstant> *)0x0;
  (this->super_MatcherBase<mp::NumericConstant>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::NumericConstant>).impl_.link_;
  (this->super_MatcherBase<mp::NumericConstant>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001c91c0;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::NumericConstant> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_>::operator=
            (&(this->super_MatcherBase<mp::NumericConstant>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::NumericConstant>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }